

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O3

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
::modify_disp_params
          (proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
           *this,environment_t *env)

{
  code *pcVar1;
  queue_params_t *__x;
  queue_params_t queue_params;
  lock_factory_t lf;
  _Any_data local_a8;
  code *local_98;
  undefined8 local_90;
  _Any_data local_80;
  code *local_70;
  undefined8 uStack_68;
  _Any_data local_60;
  code *local_50;
  internal_env_iface_t local_40;
  _Any_data local_38;
  code *local_28;
  
  __x = &(this->m_disp_params).m_queue_params;
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
              *)&local_60,&__x->m_lock_factory);
  if (local_50 == (code *)0x0) {
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)&local_80,&__x->m_lock_factory);
    local_40.m_env = env;
    impl::internal_env_iface_t::default_mpsc_queue_lock_factory
              ((lock_factory_t *)&local_38,&local_40);
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::operator=((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                 *)&local_80,
                (function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                 *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    pcVar1 = local_70;
    local_98 = (code *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_90 = uStack_68;
    if (local_70 != (code *)0x0) {
      local_70 = (code *)0x0;
      uStack_68 = 0;
      local_a8._M_unused._M_object = local_80._M_unused._M_object;
      local_a8._8_8_ = local_80._8_8_;
      local_98 = pcVar1;
    }
    mpsc_queue_traits::queue_params_t::operator=(__x,(queue_params_t *)&local_a8);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_70 != (code *)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    if (local_50 == (code *)0x0) {
      return;
    }
  }
  (*local_50)(&local_60,&local_60,__destroy_functor);
  return;
}

Assistant:

void
		modify_disp_params( so_5::environment_t & env )
			{
				auto lf = m_disp_params.queue_params().lock_factory();
				if( !lf )
				{
					auto queue_params = m_disp_params.queue_params();
					queue_params.lock_factory(
							so_5::impl::default_lock_factory( env, lf ) );
					m_disp_params.set_queue_params( std::move(queue_params) );
				}
			}